

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this,string *filename)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  PropertiesReader pr;
  
  (this->controlChannel)._M_dataplus._M_p = (pointer)&(this->controlChannel).field_2;
  (this->controlChannel)._M_string_length = 0;
  (this->controlChannel).field_2._M_local_buf[0] = '\0';
  (this->localControlChannel)._M_dataplus._M_p = (pointer)&(this->localControlChannel).field_2;
  (this->localControlChannel)._M_string_length = 0;
  (this->localControlChannel).field_2._M_local_buf[0] = '\0';
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)&(this->controlResponseChannel).field_2
  ;
  (this->controlResponseChannel)._M_string_length = 0;
  (this->controlResponseChannel).field_2._M_local_buf[0] = '\0';
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)&(this->recordingEventsChannel).field_2
  ;
  (this->recordingEventsChannel)._M_string_length = 0;
  (this->recordingEventsChannel).field_2._M_local_buf[0] = '\0';
  util::PropertiesReader::PropertiesReader(&pr,(string *)filename,true);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.message.timeout",(allocator *)&local_a8);
  local_88._M_dataplus._M_p = (pointer)0x12a05f200;
  lVar3 = util::PropertiesReader::get<long>(&pr,&local_c8,(long *)&local_88);
  this->messageTimeoutNs = lVar3;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_88,"aeron.archive.control.channel",&local_c9);
  (anonymous_namespace)::ControlChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>(&local_c8,&pr,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&this->controlChannel,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.control.stream.id",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 10;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->controlStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_88,"aeron.archive.local.control.channel",&local_c9);
  (anonymous_namespace)::LocalControlChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>(&local_c8,&pr,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&this->localControlChannel,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.local.control.stream.id",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 0xb;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->localControlStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_88,"aeron.archive.control.response.channel",&local_c9);
  (anonymous_namespace)::ControlResponseChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>(&local_c8,&pr,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&this->controlResponseChannel,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.control.response.stream.id",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 0x14;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->controlResponseStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_88,"aeron.archive.recording.events.channel",&local_c9);
  (anonymous_namespace)::RecordingEventsChannel::defaultValue_abi_cxx11_();
  util::PropertiesReader::get<std::__cxx11::string>(&local_c8,&pr,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.recording.events.stream.id",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 0x1e;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->recordingEventsStreamId = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.control.term.buffer.sparse",(allocator *)&local_88);
  local_a8._M_dataplus._M_p._0_1_ = 1;
  bVar1 = util::PropertiesReader::get<bool>(&pr,&local_c8,(bool *)&local_a8);
  this->controlTermBufferSparse = bVar1;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.control.term.buffer.length",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 0x10000;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->controlTermBufferLength = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_c8,"aeron.archive.control.mtu.length",(allocator *)&local_a8);
  local_88._M_dataplus._M_p._0_4_ = 0x580;
  iVar2 = util::PropertiesReader::get<int>(&pr,&local_c8,(int *)&local_88);
  this->controlMtuLength = iVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&pr);
  return;
}

Assistant:

Configuration::Configuration(const std::string& filename) {
    util::PropertiesReader pr(filename, true);

    messageTimeoutNs = pr.get(MessageTimeout::key(), MessageTimeout::defaultValue());
    controlChannel = pr.get(ControlChannel::key(), ControlChannel::defaultValue());
    controlStreamId = pr.get(ControlStreamId::key(), ControlStreamId::defaultValue());
    localControlChannel = pr.get(LocalControlChannel::key(), LocalControlChannel::defaultValue());
    localControlStreamId = pr.get(LocalControlStreamId::key(), LocalControlStreamId::defaultValue());
    controlResponseChannel = pr.get(ControlResponseChannel::key(), ControlResponseChannel::defaultValue());
    controlResponseStreamId = pr.get(ControlResponseStreamId::key(), ControlResponseStreamId::defaultValue());
    recordingEventsChannel = pr.get(RecordingEventsChannel::key(), RecordingEventsChannel::defaultValue());
    recordingEventsStreamId = pr.get(RecordingEventsStreamId::key(), RecordingEventsStreamId::defaultValue());
    controlTermBufferSparse = pr.get(ControlTermBufferSparse::key(), ControlTermBufferSparse::defaultValue());
    controlTermBufferLength = pr.get(ControlTermBufferLength::key(), ControlTermBufferLength::defaultValue());
    controlMtuLength = pr.get(ControlMtuLength::key(), ControlMtuLength::defaultValue());
}